

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O1

UBool __thiscall icu_63::MessagePattern::isPlural(MessagePattern *this,int32_t index)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  char16_t *pcVar4;
  
  uVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
  uVar2 = (uint)(short)uVar1;
  if ((short)uVar1 < 0) {
    uVar3 = *(uint *)((long)&(this->msg).fUnion + 4);
  }
  else {
    uVar3 = (int)uVar2 >> 5;
  }
  if ((uint)index < uVar3) {
    if ((uVar2 & 2) == 0) {
      pcVar4 = (this->msg).fUnion.fFields.fArray;
    }
    else {
      pcVar4 = (char16_t *)((long)&(this->msg).fUnion + 2);
    }
    if (((pcVar4[index] & 0xffdfU) == 0x50) && (index + 1U < uVar3)) {
      if ((uVar1 & 2) == 0) {
        pcVar4 = (this->msg).fUnion.fFields.fArray;
      }
      else {
        pcVar4 = (char16_t *)((long)&(this->msg).fUnion + 2);
      }
      if (((pcVar4[(int)(index + 1U)] & 0xffdfU) == 0x4c) && (index + 2U < uVar3)) {
        if ((uVar1 & 2) == 0) {
          pcVar4 = (this->msg).fUnion.fFields.fArray;
        }
        else {
          pcVar4 = (char16_t *)((long)&(this->msg).fUnion + 2);
        }
        if (((pcVar4[(int)(index + 2U)] & 0xffdfU) == 0x55) && (index + 3U < uVar3)) {
          if ((uVar1 & 2) == 0) {
            pcVar4 = (this->msg).fUnion.fFields.fArray;
          }
          else {
            pcVar4 = (char16_t *)((long)&(this->msg).fUnion + 2);
          }
          if (((pcVar4[(int)(index + 3U)] & 0xffdfU) == 0x52) && (index + 4U < uVar3)) {
            if ((uVar2 & 2) == 0) {
              pcVar4 = (this->msg).fUnion.fFields.fArray;
            }
            else {
              pcVar4 = (char16_t *)((long)&(this->msg).fUnion + 2);
            }
            if (((pcVar4[(int)(index + 4U)] & 0xffdfU) == 0x41) && (index + 5U < uVar3)) {
              if ((uVar1 & 2) == 0) {
                pcVar4 = (this->msg).fUnion.fFields.fArray;
              }
              else {
                pcVar4 = (char16_t *)((long)&(this->msg).fUnion + 2);
              }
              return (pcVar4[(int)(index + 5U)] & 0xffdfU) == 0x4c;
            }
          }
        }
      }
    }
  }
  return '\0';
}

Assistant:

inline UBool
UnicodeString::hasShortLength() const {
  return fUnion.fFields.fLengthAndFlags>=0;
}